

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
xemmai::t_debug_script::f_replace_break_point
          (t_debug_script *this,size_t a_line,size_t a_column,t_instruction a_old,
          t_instruction a_new)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  _Base_ptr p_Var3;
  unsigned_long uVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  key_type local_40;
  
  local_40.second = (void **)0x0;
  local_40.first = a_line;
  iVar2 = std::
          _Rb_tree<std::pair<unsigned_long,_void_**>,_std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
          ::lower_bound(&(this->v_safe_points)._M_t,&local_40);
  p_Var1 = &(this->v_safe_points)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node != p_Var1) {
    if (a_column == 0) {
LAB_00145443:
      if (*(void **)iVar2._M_node[1]._M_parent == t_code::v_labels[a_old]) {
        *(void **)iVar2._M_node[1]._M_parent = t_code::v_labels[a_new];
      }
      uVar4 = *(unsigned_long *)(iVar2._M_node + 1);
      p_Var3 = iVar2._M_node[1]._M_left;
      goto LAB_00145472;
    }
    do {
      if (*(size_t *)(iVar2._M_node + 1) != a_line) break;
      if (iVar2._M_node[1]._M_left == (_Base_ptr)a_column) goto LAB_00145443;
      iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node);
    } while ((_Rb_tree_header *)iVar2._M_node != p_Var1);
  }
  uVar4 = 0;
  p_Var3 = (_Base_ptr)0x0;
LAB_00145472:
  pVar5.second = (unsigned_long)p_Var3;
  pVar5.first = uVar4;
  return pVar5;
}

Assistant:

std::pair<size_t, size_t> t_debug_script::f_replace_break_point(size_t a_line, size_t a_column, t_instruction a_old, t_instruction a_new)
{
	auto i = v_safe_points.lower_bound({a_line, nullptr});
	if (i == v_safe_points.end()) return {0, 0};
	if (a_column > 0) {
		while (true) {
			if (i->first.first != a_line) return {0, 0};
			if (i->second == a_column) break;
			if (++i == v_safe_points.end()) return {0, 0};
		}
	}
	auto& code = v_code->f_as<t_code>();
	if (*i->first.second == code.f_p(a_old)) *i->first.second = code.f_p(a_new);
	return {i->first.first, i->second};
}